

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.hpp
# Opt level: O0

CachedSSBO * __thiscall
Diligent::ShaderResourceCacheGL::GetConstSSBO(ShaderResourceCacheGL *this,Uint32 CacheOffset)

{
  Uint32 UVar1;
  Char *Message;
  pointer puVar2;
  char (*in_R8) [18];
  undefined1 local_38 [8];
  string msg;
  Uint32 CacheOffset_local;
  ShaderResourceCacheGL *this_local;
  
  msg.field_2._12_4_ = CacheOffset;
  UVar1 = GetSSBOCount(this);
  if (UVar1 <= CacheOffset) {
    FormatString<char[29],unsigned_int,char[18]>
              ((string *)local_38,(Diligent *)"Shader storage block index (",
               (char (*) [29])((long)&msg.field_2 + 0xc),(uint *)") is out of range",in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetConstSSBO",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourceCacheGL.hpp"
               ,0x13a);
    std::__cxx11::string::~string((string *)local_38);
  }
  puVar2 = std::
           unique_ptr<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
           ::get(&this->m_pResourceData);
  return (CachedSSBO *)
         (puVar2 + (ulong)(uint)msg.field_2._12_4_ * 0x10 + (long)(int)(uint)this->m_SSBOsOffset);
}

Assistant:

const CachedSSBO& GetConstSSBO(Uint32 CacheOffset) const
    {
        VERIFY(CacheOffset < GetSSBOCount(), "Shader storage block index (", CacheOffset, ") is out of range");
        return reinterpret_cast<CachedSSBO*>(m_pResourceData.get() + m_SSBOsOffset)[CacheOffset];
    }